

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantGep
          (LLVMPointerGraphBuilder *this,GetElementPtrInst *GEP)

{
  bool bVar1;
  APInt *pAVar2;
  ulong uVar3;
  uint64_t o;
  DataLayout *in_RSI;
  APInt *in_RDI;
  APInt offset;
  uint bitwidth;
  PSNode *opNode;
  Value *op;
  Pointer pointer;
  PSNode *n;
  Pointer *in_stack_ffffffffffffff78;
  DataLayout *Str;
  Offset in_stack_ffffffffffffff80;
  Offset local_30;
  Value *local_28;
  DataLayout *local_20;
  Pointer local_10;
  
  local_20 = in_RSI;
  local_28 = llvm::GetElementPtrInst::getPointerOperand((GetElementPtrInst *)0x1b631b);
  n = UNKNOWN_MEMORY;
  Offset::Offset(&local_30,Offset::UNKNOWN);
  Pointer::Pointer(&local_10,n,local_30);
  getOperand((LLVMPointerGraphBuilder *)in_stack_ffffffffffffff78,(Value *)in_RDI);
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_RDI);
  PointerIdPointsToSet::const_iterator::operator*((const_iterator *)n);
  Pointer::operator=((Pointer *)in_stack_ffffffffffffff80.offset,in_stack_ffffffffffffff78);
  llvm::Module::getDataLayout();
  llvmutils::getPointerBitwidth
            ((DataLayout *)in_stack_ffffffffffffff80.offset,(Value *)in_stack_ffffffffffffff78);
  llvm::APInt::APInt((APInt *)in_stack_ffffffffffffff80.offset,
                     (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint64_t)in_RDI,
                     SUB81((ulong)n >> 0x38,0));
  pAVar2 = (APInt *)llvm::Module::getDataLayout();
  uVar3 = llvm::GetElementPtrInst::accumulateConstantOffset(local_20,pAVar2);
  if ((uVar3 & 1) != 0) {
    bVar1 = llvm::APInt::isIntN(in_RDI,(uint)((ulong)n >> 0x20));
    Str = local_20;
    if ((!bVar1) || (bVar1 = Offset::isUnknown(&local_10.offset), Str = local_20, bVar1)) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff80.offset,(char *)Str);
      llvm::raw_ostream::operator<<((raw_ostream *)in_RDI,(uint)((ulong)n >> 0x20));
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff80.offset,(char *)Str);
      llvm::operator<<((raw_ostream *)in_RDI,(Value *)n);
      llvm::raw_ostream::operator<<((raw_ostream *)in_stack_ffffffffffffff80.offset,(char *)Str);
    }
    else {
      o = llvm::APInt::getZExtValue((APInt *)n);
      Offset::Offset((Offset *)&stack0xffffffffffffff80,o);
      Offset::operator=(&local_10.offset,in_stack_ffffffffffffff80);
    }
  }
  llvm::APInt::~APInt(in_RDI);
  return local_10;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantGep(const llvm::GetElementPtrInst *GEP) {
    using namespace llvm;

    const Value *op = GEP->getPointerOperand();
    Pointer pointer(UNKNOWN_MEMORY, Offset::UNKNOWN);

    // get operand PSNode (this may result in recursive call,
    // if this gep is recursively defined)
    PSNode *opNode = getOperand(op);
    assert(opNode->pointsTo.size() == 1 &&
           "Constant node has more that 1 pointer");
    pointer = *(opNode->pointsTo.begin());

    unsigned bitwidth = llvmutils::getPointerBitwidth(&M->getDataLayout(), op);
    APInt offset(bitwidth, 0);

    // get offset of this GEP
    if (GEP->accumulateConstantOffset(M->getDataLayout(), offset)) {
        if (offset.isIntN(bitwidth) && !pointer.offset.isUnknown())
            pointer.offset = offset.getZExtValue();
        else
            errs() << "WARN: Offset greater than " << bitwidth << "-bit" << *GEP
                   << "\n";
    }

    return pointer;
}